

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O2

void __thiscall
Annotator_assignVariableVariableId_Test::TestBody(Annotator_assignVariableVariableId_Test *this)

{
  bool bVar1;
  char *pcVar2;
  string local_160 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_158 [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  allocator<char> local_11c;
  allocator<char> local_11b;
  allocator<char> local_11a;
  allocator<char> local_119;
  VariablePairPtr variablePair;
  AssertionResult gtest_ar;
  string local_e8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_e0 [3];
  ModelPtr model;
  AnnotatorPtr annotator;
  string local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  string local_98 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_90;
  string local_88 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  string local_78 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_70;
  undefined1 local_68 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  ParserPtr parser;
  shared_ptr local_48 [32];
  shared_ptr local_28 [32];
  
  libcellml::Annotator::create();
  libcellml::Parser::create(SUB81(&parser,0));
  libcellml::Parser::parseModel((string *)&model);
  bVar1 = (bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_140,"component2",&local_119);
  libcellml::ComponentEntity::component(local_88,bVar1);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar,"variable1",&local_11a);
  libcellml::Component::variable(local_78);
  std::__cxx11::string::string<std::allocator<char>>(local_160,"component2",&local_11b);
  libcellml::ComponentEntity::component
            (local_a8,(bool)model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>.
                            _M_ptr._0_1_);
  std::__cxx11::string::string<std::allocator<char>>(local_e8,"variable1",&local_11c);
  libcellml::Component::variable(local_98);
  libcellml::Variable::equivalentVariable((ulong)local_68);
  libcellml::VariablePair::create((shared_ptr *)&variablePair,(shared_ptr *)local_78);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_60);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90);
  std::__cxx11::string::~string(local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
  std::__cxx11::string::~string(local_160);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_70);
  std::__cxx11::string::~string((string *)&gtest_ar);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80);
  std::__cxx11::string::~string((string *)&local_140);
  libcellml::Annotator::setModel
            ((shared_ptr *)
             annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  libcellml::VariablePair::variable1();
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_140,(shared_ptr *)local_160);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"",
             "libcellml::Variable::equivalenceConnectionId(variablePair->variable1(), variablePair->variable2())"
             ,(char (*) [1])0x153c1a,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_140);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x4bd,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_160,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_140);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::VariablePair::variable1();
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_140,(shared_ptr *)local_160);
  pcVar2 = "";
  testing::internal::CmpHelperEQ<char[1],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"\"",
             "libcellml::Variable::equivalenceMappingId(variablePair->variable1(), variablePair->variable2())"
             ,(char (*) [1])0x153c1a,&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_140);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x4be,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_160,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_140);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            (local_28,(CellmlElementType)
                      annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  std::__cxx11::string::~string((string *)local_28);
  libcellml::VariablePair::variable1();
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceConnectionId_abi_cxx11_
            ((shared_ptr *)&local_140,(shared_ptr *)local_160);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"b4da55\"",
             "libcellml::Variable::equivalenceConnectionId(variablePair->variable1(), variablePair->variable2())"
             ,(char (*) [7])"b4da55",&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_140);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x4c1,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_160,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_140);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  libcellml::Annotator::assignId_abi_cxx11_
            (local_48,(CellmlElementType)
                      annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  std::__cxx11::string::~string((string *)local_48);
  libcellml::VariablePair::variable1();
  libcellml::VariablePair::variable2();
  libcellml::Variable::equivalenceMappingId_abi_cxx11_
            ((shared_ptr *)&local_140,(shared_ptr *)local_160);
  testing::internal::CmpHelperEQ<char[7],std::__cxx11::string>
            ((internal *)&gtest_ar,"\"b4da56\"",
             "libcellml::Variable::equivalenceMappingId(variablePair->variable1(), variablePair->variable2())"
             ,(char (*) [7])"b4da56",&local_140);
  std::__cxx11::string::~string((string *)&local_140);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_e0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(local_158);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_140);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_160,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x4c3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_160,(Message *)&local_140);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_160);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_140);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&variablePair.super___shared_ptr<libcellml::VariablePair,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&parser.super___shared_ptr<libcellml::Parser,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&annotator.super___shared_ptr<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

TEST(Annotator, assignVariableVariableId)
{
    auto annotator = libcellml::Annotator::create();
    auto parser = libcellml::Parser::create();
    auto model = parser->parseModel(modelStringNoIds);

    auto variablePair = libcellml::VariablePair::create(
        model->component("component2")->variable("variable1"),
        model->component("component2")->variable("variable1")->equivalentVariable(0));

    annotator->setModel(model);

    EXPECT_EQ("", libcellml::Variable::equivalenceConnectionId(variablePair->variable1(), variablePair->variable2()));
    EXPECT_EQ("", libcellml::Variable::equivalenceMappingId(variablePair->variable1(), variablePair->variable2()));

    annotator->assignId(variablePair, libcellml::CellmlElementType::CONNECTION);
    EXPECT_EQ("b4da55", libcellml::Variable::equivalenceConnectionId(variablePair->variable1(), variablePair->variable2()));
    annotator->assignId(variablePair);
    EXPECT_EQ("b4da56", libcellml::Variable::equivalenceMappingId(variablePair->variable1(), variablePair->variable2()));
}